

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase511::run(TestCase511 *this)

{
  bool bVar1;
  ForkedPromise<int> *pFVar2;
  SourceLocation local_260;
  __pid_t local_244;
  int local_240;
  bool local_23a;
  undefined1 auStack_238 [6];
  bool _kj_shouldLog_1;
  __pid_t local_21c;
  int local_218;
  DebugExpression<int> local_214;
  undefined1 local_210 [8];
  DebugComparison<int,_int> _kjCondition_6;
  SourceLocation local_1e8;
  __pid_t local_1cc;
  int local_1c8;
  bool local_1c2;
  undefined1 auStack_1c0 [6];
  bool _kj_shouldLog;
  __pid_t local_1a4;
  int local_1a0;
  DebugExpression<int> local_19c;
  undefined1 local_198 [8];
  DebugComparison<int,_int> _kjCondition_5;
  ForkedPromise<int> releaseFork;
  Fault f_4;
  undefined1 local_158 [6];
  DebugExpression<bool> _kjCondition_4;
  Promise<int> local_150;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_test_c__:536:40),_int>
  branch2;
  Fault f_3;
  undefined1 local_138 [6];
  DebugExpression<bool> _kjCondition_3;
  Promise<int> local_130;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_test_c__:531:40),_int>
  branch1;
  Fault f_2;
  DebugExpression<bool> _kjCondition_2;
  Fault f_1;
  undefined1 local_108 [7];
  DebugExpression<bool> _kjCondition_1;
  Promise<int> cancelBranch;
  Fault f;
  undefined1 auStack_f0 [6];
  DebugExpression<bool> _kjCondition;
  undefined1 local_d8 [8];
  ForkedPromise<int> fork;
  undefined1 local_c0 [8];
  Promise<int> promise;
  WaitScope waitScope;
  EventLoop loop;
  TestCase511 *this_local;
  
  EventLoop::EventLoop((EventLoop *)&waitScope.runningStacksPool);
  WaitScope::WaitScope
            ((WaitScope *)&stack0xffffffffffffff58,(EventLoop *)&waitScope.runningStacksPool);
  evalLater<kj::(anonymous_namespace)::TestCase511::run()::__0>
            ((kj *)local_c0,(Type *)((long)&fork.hub.ptr + 7));
  SourceLocation::SourceLocation
            ((SourceLocation *)auStack_f0,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
             ,"run",0x205,0xf);
  Promise<int>::fork((Promise<int> *)local_d8);
  bVar1 = ForkedPromise<int>::hasBranches((ForkedPromise<int> *)local_d8);
  f.exception._5_1_ = ~bVar1 & 1;
  f.exception._6_1_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)((long)&f.exception + 5));
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)((long)&f.exception + 6))
  ;
  if (!bVar1) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
              ((Fault *)&cancelBranch,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x20c,FAILED,"!fork.hasBranches()","_kjCondition,",
               (DebugExpression<bool> *)((long)&f.exception + 6));
    kj::_::Debug::Fault::fatal((Fault *)&cancelBranch);
  }
  ForkedPromise<int>::addBranch((ForkedPromise<int> *)local_108);
  f_1.exception._6_1_ = ForkedPromise<int>::hasBranches((ForkedPromise<int> *)local_d8);
  f_1.exception._7_1_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)((long)&f_1.exception + 6));
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool
                    ((DebugExpression *)((long)&f_1.exception + 7));
  if (!bVar1) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
              ((Fault *)&stack0xfffffffffffffee8,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x20f,FAILED,"fork.hasBranches()","_kjCondition,",
               (DebugExpression<bool> *)((long)&f_1.exception + 7));
    kj::_::Debug::Fault::fatal((Fault *)&stack0xfffffffffffffee8);
  }
  Promise<int>::~Promise((Promise<int> *)local_108);
  bVar1 = ForkedPromise<int>::hasBranches((ForkedPromise<int> *)local_d8);
  f_2.exception._6_1_ = ~bVar1 & 1;
  f_2.exception._7_1_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)((long)&f_2.exception + 6));
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool
                    ((DebugExpression *)((long)&f_2.exception + 7));
  if (!bVar1) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
              ((Fault *)&branch1,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x211,FAILED,"!fork.hasBranches()","_kjCondition,",
               (DebugExpression<bool> *)((long)&f_2.exception + 7));
    kj::_::Debug::Fault::fatal((Fault *)&branch1);
  }
  ForkedPromise<int>::addBranch((ForkedPromise<int> *)local_138);
  Promise<int>::then<kj::(anonymous_namespace)::TestCase511::run()::__1>
            (&local_130,(Type *)local_138);
  Promise<int>::~Promise((Promise<int> *)local_138);
  f_3.exception._5_1_ = ForkedPromise<int>::hasBranches((ForkedPromise<int> *)local_d8);
  f_3.exception._6_1_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)((long)&f_3.exception + 5));
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool
                    ((DebugExpression *)((long)&f_3.exception + 6));
  if (bVar1) {
    ForkedPromise<int>::addBranch((ForkedPromise<int> *)local_158);
    Promise<int>::then<kj::(anonymous_namespace)::TestCase511::run()::__2>
              (&local_150,(Type *)local_158);
    Promise<int>::~Promise((Promise<int> *)local_158);
    f_4.exception._5_1_ = ForkedPromise<int>::hasBranches((ForkedPromise<int> *)local_d8);
    f_4.exception._6_1_ =
         kj::_::DebugExpressionStart::operator<<
                   ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)((long)&f_4.exception + 5))
    ;
    bVar1 = kj::_::DebugExpression::operator_cast_to_bool
                      ((DebugExpression *)((long)&f_4.exception + 6));
    if (bVar1) {
      pFVar2 = mv<kj::ForkedPromise<int>>((ForkedPromise<int> *)local_d8);
      ForkedPromise<int>::ForkedPromise((ForkedPromise<int> *)&_kjCondition_5.result,pFVar2);
      ForkedPromise<int>::~ForkedPromise((ForkedPromise<int> *)&_kjCondition_5.result);
      local_1a0 = 0x1c8;
      local_19c = kj::_::DebugExpressionStart::operator<<
                            ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1a0);
      SourceLocation::SourceLocation
                ((SourceLocation *)auStack_1c0,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
                 ,"run",0x222,0x29);
      local_1a4 = Promise<int>::wait(&local_130,&stack0xffffffffffffff58);
      kj::_::DebugExpression<int>::operator==
                ((DebugComparison<int,_int> *)local_198,&local_19c,&local_1a4);
      bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_198);
      if (!bVar1) {
        local_1c2 = kj::_::Debug::shouldLog(ERROR);
        while (local_1c2 != false) {
          local_1c8 = 0x1c8;
          SourceLocation::SourceLocation
                    (&local_1e8,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
                     ,"run",0x222,0x29);
          local_1cc = Promise<int>::wait(&local_130,&stack0xffffffffffffff58);
          kj::_::Debug::log<char_const(&)[52],kj::_::DebugComparison<int,int>&,int,int>
                    ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
                     ,0x222,ERROR,
                     "\"failed: expected \" \"(456) == (branch1.wait(waitScope))\", _kjCondition, 456, branch1.wait(waitScope)"
                     ,(char (*) [52])"failed: expected (456) == (branch1.wait(waitScope))",
                     (DebugComparison<int,_int> *)local_198,&local_1c8,&local_1cc);
          local_1c2 = false;
        }
      }
      local_218 = 0x315;
      local_214 = kj::_::DebugExpressionStart::operator<<
                            ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_218);
      SourceLocation::SourceLocation
                ((SourceLocation *)auStack_238,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
                 ,"run",0x223,0x29);
      local_21c = Promise<int>::wait(&local_150,&stack0xffffffffffffff58);
      kj::_::DebugExpression<int>::operator==
                ((DebugComparison<int,_int> *)local_210,&local_214,&local_21c);
      bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_210);
      if (!bVar1) {
        local_23a = kj::_::Debug::shouldLog(ERROR);
        while (local_23a != false) {
          local_240 = 0x315;
          SourceLocation::SourceLocation
                    (&local_260,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
                     ,"run",0x223,0x29);
          local_244 = Promise<int>::wait(&local_150,&stack0xffffffffffffff58);
          kj::_::Debug::log<char_const(&)[52],kj::_::DebugComparison<int,int>&,int,int>
                    ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
                     ,0x223,ERROR,
                     "\"failed: expected \" \"(789) == (branch2.wait(waitScope))\", _kjCondition, 789, branch2.wait(waitScope)"
                     ,(char (*) [52])"failed: expected (789) == (branch2.wait(waitScope))",
                     (DebugComparison<int,_int> *)local_210,&local_240,&local_244);
          local_23a = false;
        }
      }
      Promise<int>::~Promise(&local_150);
      Promise<int>::~Promise(&local_130);
      ForkedPromise<int>::~ForkedPromise((ForkedPromise<int> *)local_d8);
      Promise<int>::~Promise((Promise<int> *)local_c0);
      WaitScope::~WaitScope((WaitScope *)&stack0xffffffffffffff58);
      EventLoop::~EventLoop((EventLoop *)&waitScope.runningStacksPool);
      return;
    }
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
              ((Fault *)&releaseFork.hub.ptr,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x21c,FAILED,"fork.hasBranches()","_kjCondition,",
               (DebugExpression<bool> *)((long)&f_4.exception + 6));
    kj::_::Debug::Fault::fatal((Fault *)&releaseFork.hub.ptr);
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
            ((Fault *)&branch2,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
             ,0x217,FAILED,"fork.hasBranches()","_kjCondition,",
             (DebugExpression<bool> *)((long)&f_3.exception + 6));
  kj::_::Debug::Fault::fatal((Fault *)&branch2);
}

Assistant:

TEST(Async, Fork) {
  EventLoop loop;
  WaitScope waitScope(loop);

  Promise<int> promise = evalLater([&]() { return 123; });

  auto fork = promise.fork();

#if __GNUC__ && !__clang__ && __GNUC__ >= 7
// GCC 7 decides the open-brace below is "misleadingly indented" as if it were guarded by the `for`
// that appears in the implementation of KJ_REQUIRE(). Shut up shut up shut up.
#pragma GCC diagnostic ignored "-Wmisleading-indentation"
#endif
  KJ_ASSERT(!fork.hasBranches());
  {
    auto cancelBranch = fork.addBranch();
    KJ_ASSERT(fork.hasBranches());
  }
  KJ_ASSERT(!fork.hasBranches());

  auto branch1 = fork.addBranch().then([](int i) {
    EXPECT_EQ(123, i);
    return 456;
  });
  KJ_ASSERT(fork.hasBranches());
  auto branch2 = fork.addBranch().then([](int i) {
    EXPECT_EQ(123, i);
    return 789;
  });
  KJ_ASSERT(fork.hasBranches());

  {
    auto releaseFork = kj::mv(fork);
  }

  EXPECT_EQ(456, branch1.wait(waitScope));
  EXPECT_EQ(789, branch2.wait(waitScope));
}